

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
abstract_value(abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  Value *in_RSI;
  undefined8 *in_RDI;
  
  Value::Value(in_RSI);
  *in_RDI = &PTR__abstract_value_001b4550;
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x176387);
  in_RDI[5] = in_RSI;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  return;
}

Assistant:

abstract_value(T* t)
                    : m_store(t)
            {
            }